

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atan.c
# Opt level: O1

double c_atan(double x)

{
  bool bVar1;
  double x_00;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double local_58;
  
  if ((x == 0.0) && (!NAN(x))) {
    return x;
  }
  if ((INFINITY == x) && (!NAN(INFINITY) && !NAN(x))) {
    return PIO2;
  }
  if ((-INFINITY == x) && (!NAN(-INFINITY) && !NAN(x))) {
    return -PIO2;
  }
  dVar5 = -x;
  if (-x <= x) {
    dVar5 = x;
  }
  if (dVar5 <= 2.414213562373095) {
    if (dVar5 <= 0.66) {
      local_58 = 0.0;
      bVar1 = false;
      dVar4 = dVar5;
    }
    else {
      local_58 = PIO4;
      bVar1 = true;
      dVar4 = (dVar5 + -1.0) / (dVar5 + 1.0);
    }
  }
  else {
    local_58 = PIO2;
    bVar1 = false;
    dVar4 = -1.0 / dVar5;
  }
  x_00 = dVar4 * dVar4;
  dVar2 = polevl(x_00,P,4);
  dVar3 = p1evl(x_00,Q,5);
  dVar4 = ((dVar2 * x_00) / dVar3) * dVar4 + dVar4;
  if (bVar1) {
    dVar4 = dVar4 + 3.061616997868383e-17;
  }
  else if (2.414213562373095 < dVar5) {
    dVar4 = dVar4 + 6.123233995736766e-17;
  }
  return (double)(-(ulong)(x < 0.0) & (ulong)-(local_58 + dVar4) |
                 ~-(ulong)(x < 0.0) & (ulong)(local_58 + dVar4));
}

Assistant:

double c_atan(x)
double x;
{
double y, z;
short sign, flag;

#ifdef MINUSZERO
if( x == 0.0 )
	return(x);
#endif
#ifdef INFINITIES
if(x == INFINITY)
	return(PIO2);
if(x == -INFINITY)
	return(-PIO2);
#endif
/* make argument positive and save the sign */
sign = 1;
if( x < 0.0 )
	{
	sign = -1;
	x = -x;
	}
/* range reduction */
flag = 0;
if( x > T3P8 )
	{
	y = PIO2;
	flag = 1;
	x = -( 1.0/x );
	}
else if( x <= 0.66 )
	{
	y = 0.0;
	}
else
	{
	y = PIO4;
	flag = 2;
	x = (x-1.0)/(x+1.0);
	}
z = x * x;
z = z * polevl( z, P, 4 ) / p1evl( z, Q, 5 );
z = x * z + x;
if( flag == 2 )
	z += 0.5 * MOREBITS;
else if( flag == 1 )
	z += MOREBITS;
y = y + z;
if( sign < 0 )
	y = -y;
return(y);
}